

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeQueue.h
# Opt level: O1

void __thiscall
NotLockFreeQueue<std::packaged_task<void_()>_>::NotLockFreeQueue
          (NotLockFreeQueue<std::packaged_task<void_()>_> *this,size_t max_size_)

{
  (this->queue).c.
  super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->queue).c.
  super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->queue).c.
  super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->queue).c.
  super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->queue).c.
  super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queue).c.
  super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queue).c.
  super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queue).c.
  super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queue).c.
  super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queue).c.
  super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                     *)this,0);
  this->max_size = max_size_;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cond_var_pop);
  std::condition_variable::condition_variable(&this->cond_var_push);
  return;
}

Assistant:

NotLockFreeQueue<T>::NotLockFreeQueue(size_t max_size_) : 
        max_size(max_size_) {}